

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O3

void __thiscall SimpleParallelAnalyzer::WorkerThread(SimpleParallelAnalyzer *this)

{
  pointer *pppAVar1;
  ParallelAnalyzerClockEdge PVar2;
  ParallelAnalyzerClockEdge PVar3;
  pointer ppAVar4;
  pointer puVar5;
  pointer pCVar6;
  pointer pCVar7;
  long lVar8;
  iterator __position;
  iterator __position_00;
  char cVar9;
  unsigned_short uVar10;
  uint16_t uVar11;
  U32 UVar12;
  int iVar13;
  AnalyzerChannelData *pAVar14;
  ulong uVar15;
  uint64_t sample_number;
  SimpleParallelAnalyzerSettings *pSVar16;
  ulong uVar17;
  long lVar18;
  pointer this_00;
  bool bVar19;
  undefined1 auVar20 [16];
  double dVar21;
  Frame frame;
  Frame last_frame;
  FrameV2 frame_v2;
  uint64_t local_a8;
  long lStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  ushort local_88;
  undefined8 local_80;
  AnalyzerChannelData *local_78;
  long lStack_70;
  ulong local_68;
  undefined8 uStack_60;
  ushort local_58;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_48;
  vector<AnalyzerChannelData*,std::allocator<AnalyzerChannelData*>> *local_40;
  FrameV2 local_38 [8];
  
  UVar12 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar12;
  PVar2 = ((this->mSettings)._M_t.
           super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl)->mClockEdge
  ;
  pAVar14 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar14;
  ppAVar4 = (this->mData).
            super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar4) {
    (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar4;
  }
  puVar5 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar5) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  pCVar6 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar7 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pCVar6;
  if (pCVar7 != pCVar6) {
    do {
      Channel::~Channel(this_00);
      this_00 = this_00 + 0x10;
    } while (this_00 != pCVar7);
    (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar6;
  }
  pSVar16 = (this->mSettings)._M_t.
            super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
            ._M_t.
            super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
            .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl;
  uVar15 = (ulong)((long)*(pointer *)
                          ((long)&(pSVar16->mDataChannels).
                                  super__Vector_base<Channel,_std::allocator<Channel>_> + 8) -
                  *(long *)&(pSVar16->mDataChannels).
                            super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl) >> 4;
  if ((int)uVar15 != 0) {
    local_40 = (vector<AnalyzerChannelData*,std::allocator<AnalyzerChannelData*>> *)&this->mData;
    local_48 = &this->mDataMasks;
    local_80 = &this->mDataChannels;
    lVar18 = 0;
    uVar17 = 0;
    do {
      lVar8 = *(long *)&(((this->mSettings)._M_t.
                          super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                          .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>.
                         _M_head_impl)->mDataChannels).
                        super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl;
      Channel::Channel((Channel *)&local_78,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      cVar9 = Channel::operator!=((Channel *)(lVar8 + lVar18),(Channel *)&local_78);
      Channel::~Channel((Channel *)&local_78);
      if (cVar9 != '\0') {
        local_78 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
        __position._M_current =
             (this->mData).
             super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mData).
            super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<AnalyzerChannelData*,std::allocator<AnalyzerChannelData*>>::
          _M_realloc_insert<AnalyzerChannelData*>(local_40,__position,&local_78);
        }
        else {
          *__position._M_current = local_78;
          pppAVar1 = &(this->mData).
                      super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        uVar10 = (unsigned_short)(1 << ((byte)uVar17 & 0x1f));
        local_78 = (AnalyzerChannelData *)CONCAT62(local_78._2_6_,uVar10);
        __position_00._M_current =
             (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(local_48,__position_00,(unsigned_short *)&local_78);
        }
        else {
          *__position_00._M_current = uVar10;
          (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
        std::vector<Channel,_std::allocator<Channel>_>::push_back
                  (local_80,(value_type *)
                            (*(long *)&(((this->mSettings)._M_t.
                                         super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
                                         .
                                         super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>
                                        ._M_head_impl)->mDataChannels).
                                       super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl
                            + lVar18));
      }
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while ((uVar15 & 0xffffffff) != uVar17);
    pSVar16 = (this->mSettings)._M_t.
              super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
              ._M_t.
              super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
              .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl;
  }
  PVar3 = pSVar16->mClockEdge;
  if (PVar3 == PosEdge) {
    iVar13 = AnalyzerChannelData::GetBitState();
    if (iVar13 != 1) goto LAB_00105e9a;
  }
  else {
    if (PVar3 != NegEdge) {
      if (PVar3 != DualEdge) goto LAB_00105e9a;
      DecodeBothEdges(this);
    }
    iVar13 = AnalyzerChannelData::GetBitState();
    if (iVar13 != 0) goto LAB_00105e9a;
  }
  AnalyzerChannelData::AdvanceToNextEdge();
LAB_00105e9a:
  local_80 = (vector<Channel,_std::allocator<Channel>_> *)
             (CONCAT44(local_80._4_4_,(uint)(PVar2 == NegEdge)) | 4);
  AnalyzerChannelData::AdvanceToNextEdge();
  Frame::Frame((Frame *)&local_78);
  bVar19 = true;
  do {
    sample_number = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker
              ((ulonglong)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
               (MarkerType)sample_number,(Channel *)((ulong)local_80 & 0xffffffff));
    uVar11 = GetWordAtLocation(this,sample_number);
    FrameV2::FrameV2(local_38);
    FrameV2::AddInteger((char *)local_38,0x109030);
    Frame::Frame((Frame *)&local_a8);
    local_88 = local_88 & 0xff;
    local_a8 = sample_number;
    local_98 = (ulong)uVar11;
    cVar9 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar9 == '\0') {
      uVar15 = 10;
      if (!bVar19) {
        lVar18 = (lStack_70 - (long)local_78) + 1;
        auVar20._8_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar20._0_8_ = lVar18;
        auVar20._12_4_ = 0x45300000;
        dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) * 0.1;
        uVar15 = (ulong)dVar21;
        uVar15 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15;
        if (uVar15 < 4) {
          uVar15 = 3;
        }
      }
      cVar9 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mClock);
      if (cVar9 == '\0') {
        lStack_a0 = (uVar15 - 1) + sample_number;
        if (lStack_a0 <= (long)local_a8) {
          lStack_a0 = local_a8 + 1;
        }
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)local_38,0x109030,local_a8);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        cVar9 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if (cVar9 != '\0') {
          AnalyzerChannelData::AdvanceToNextEdge();
          lStack_a0 = AnalyzerChannelData::GetSampleNumber();
          lStack_a0 = lStack_a0 + -1;
          AnalyzerResults::AddFrame
                    ((Frame *)(this->mResults)._M_t.
                              super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                              .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                              _M_head_impl);
          AnalyzerResults::AddFrameV2
                    ((FrameV2 *)
                     (this->mResults)._M_t.
                     super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                     .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                     (char *)local_38,0x109030,local_a8);
          AnalyzerResults::CommitResults();
          goto LAB_0010617f;
        }
        lStack_a0 = AnalyzerChannelData::GetSampleNumber();
        lStack_a0 = lStack_a0 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)local_38,0x109030,local_a8);
        AnalyzerResults::CommitResults();
      }
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      cVar9 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if (cVar9 == '\0') {
        lStack_a0 = AnalyzerChannelData::GetSampleNumber();
        lStack_a0 = lStack_a0 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)local_38,0x109030,local_a8);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        lStack_a0 = AnalyzerChannelData::GetSampleNumber();
        lStack_a0 = lStack_a0 + -1;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                            .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>.
                            _M_head_impl);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
                   (char *)local_38,0x109030,local_a8);
        AnalyzerResults::CommitResults();
      }
    }
LAB_0010617f:
    local_58 = local_88;
    local_68 = local_98;
    uStack_60 = uStack_90;
    local_78 = (AnalyzerChannelData *)local_a8;
    lStack_70 = lStack_a0;
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame((Frame *)&local_a8);
    FrameV2::~FrameV2(local_38);
    bVar19 = false;
  } while( true );
}

Assistant:

void SimpleParallelAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    AnalyzerResults::MarkerType clock_arrow;
    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
        clock_arrow = AnalyzerResults::DownArrow;
    else
        clock_arrow = AnalyzerResults::UpArrow;


    mClock = GetAnalyzerChannelData( mSettings->mClockChannel );
    mData.clear();
    mDataMasks.clear();
    mDataChannels.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] != UNDEFINED_CHANNEL )
        {
            mData.push_back( GetAnalyzerChannelData( mSettings->mDataChannels[ i ] ) );
            mDataMasks.push_back( 1 << i );
            mDataChannels.push_back( mSettings->mDataChannels[ i ] );
        }
    }


    U32 num_data_lines = mData.size();

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        if( mClock->GetBitState() == BIT_LOW )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        if( mClock->GetBitState() == BIT_HIGH )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        // handling both edges is different enough to warrant a separate implementation.
        DecodeBothEdges();
        return;
    }

    mClock->AdvanceToNextEdge(); // this is the data-valid edge

    Frame last_frame;
    bool is_first_frame = true;
    for( ;; )
    {
        // We always start this loop on an active edge.

        U64 sample = mClock->GetSampleNumber();
        mResults->AddMarker( sample, clock_arrow, mSettings->mClockChannel );

        U16 result = GetWordAtLocation( sample );

        FrameV2 frame_v2;
        frame_v2.AddInteger( "data", result );

        Frame frame;
        frame.mData1 = result;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = sample;

        // The code in these if/else blocks could be replaced with 2 `AdvanceToNextEdge` calls, but if no more transitions are encountered,
        // the current state will never be output as a frame. These blocks will detect that case in the available data, and output a frame
        // immediately, and then another one once the next active edge sample is known.
        if( !mClock->DoMoreTransitionsExistInCurrentData() )
        {
            // There are no transitions available in the current data. Estimate what the frame size might be as 10 if we haven't seen any
            // frames yet, otherwise use 10% of the last frame size.
            U64 estimated_frame_size = 10;
            if( !is_first_frame )
            {
                U64 last_frame_sample_count = last_frame.mEndingSampleInclusive - last_frame.mStartingSampleInclusive + 1;
                estimated_frame_size = last_frame_sample_count * 0.1;
                if( estimated_frame_size < 3 )
                {
                    estimated_frame_size = 3;
                }
            }

            // Make sure we haven't gone past the end of the _real_ frame. WouldAdvancingCauseTransition can block, in which case more
            // transitions might show up.
            if( mClock->WouldAdvancingCauseTransition( estimated_frame_size ) )
            {
                // Move to inactive edge
                mClock->AdvanceToNextEdge();
                if( mClock->DoMoreTransitionsExistInCurrentData() )
                {
                    // Move to active edge
                    mClock->AdvanceToNextEdge();

                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();
                }
                else
                {
                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();

                    // Move to active edge
                    mClock->AdvanceToNextEdge();
                }
            }
            else
            {
                frame.mEndingSampleInclusive = sample + estimated_frame_size - 1;
                if( frame.mEndingSampleInclusive <= frame.mStartingSampleInclusive )
                {
                    frame.mEndingSampleInclusive = frame.mStartingSampleInclusive + 1;
                }
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to inactive edge, and then the active edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
            }
        }
        else
        {
            // Move to inactive edge
            mClock->AdvanceToNextEdge();

            if( mClock->DoMoreTransitionsExistInCurrentData() )
            {
                // Move to active edge
                mClock->AdvanceToNextEdge();

                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();
            }
            else
            {
                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to active edge
                mClock->AdvanceToNextEdge();
            }
        }

        // Note: mClock should always be at an active edge at this point, and `frame` should have been added.

        is_first_frame = false;
        last_frame = frame;

        ReportProgress( frame.mEndingSampleInclusive );
    }
}